

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int SafeDecodeCommandBlockSwitch(BrotliDecoderStateInternal *s,int position)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  HuffmanCode *table;
  BrotliBitReader *br_00;
  bool bVar5;
  ulong local_480;
  int position_local;
  BrotliDecoderStateInternal *s_local;
  int local_424;
  uint64_t local_420;
  BrotliBitReaderState memento;
  uint32_t block_type;
  uint32_t *ringbuffer;
  BrotliBitReader *br;
  HuffmanCode *len_tree;
  HuffmanCode *type_tree;
  uint32_t max_block_type;
  uint local_3b8;
  uint32_t nbits_5;
  uint32_t bits;
  uint32_t index;
  HuffmanCode *local_3a8;
  uint32_t *local_3a0;
  BrotliDecoderStateInternal *local_398;
  uint local_31c;
  uint32_t *puStack_318;
  uint32_t val_2;
  BrotliBitReader *local_310;
  HuffmanCode *local_308;
  int local_2fc;
  uint *local_2f8;
  undefined4 local_2ec;
  BrotliBitReader *local_2e8;
  int local_2dc;
  undefined4 local_2d8;
  uint32_t local_2d4;
  BrotliBitReader *local_2d0;
  BrotliBitReader *local_2c8;
  BrotliBitReader *local_2c0;
  uint local_2b8;
  uint local_2b4;
  uint32_t *puStack_2b0;
  uint32_t val_1;
  BrotliBitReader *local_2a8;
  HuffmanCode *local_2a0;
  int local_294;
  uint *local_290;
  undefined4 local_284;
  BrotliBitReader *local_280;
  int local_274;
  undefined4 local_270;
  uint32_t local_26c;
  BrotliBitReader *local_268;
  BrotliBitReader *local_260;
  BrotliBitReader *local_258;
  uint local_250;
  uint local_24c;
  BrotliBitReader *pBStack_248;
  uint32_t nbits_3;
  HuffmanCode *local_240;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  BrotliBitReader *local_228;
  undefined4 local_21c;
  BrotliBitReader *local_218;
  uint32_t nbits_4;
  HuffmanCode *local_200;
  uint32_t nbits;
  uint32_t nbits_1;
  uint32_t code;
  uint32_t nbits_2;
  uint64_t *local_108;
  BrotliBitReader *local_100;
  uint32_t val;
  
  uVar2 = s->num_block_types[1];
  local_2a0 = s->block_type_trees + 0x278;
  table = s->block_len_trees + 0x18c;
  br_00 = &s->br;
  if (uVar2 < 2) {
    bVar5 = false;
    goto LAB_001c4e3e;
  }
  local_108 = &local_420;
  local_420 = br_00->val_;
  memento.val_._0_4_ = (s->br).bit_pos_;
  memento._8_8_ = (s->br).next_in;
  memento.next_in = (uint8_t *)(s->br).avail_in;
  puStack_2b0 = (uint32_t *)((long)&memento.avail_in + 4);
  local_284 = 0xf;
  local_290 = &local_2b4;
  do {
    if (0xe < 0x40 - (s->br).bit_pos_) {
      local_270 = 0xf;
      local_26c = 0x7fff;
      local_2b4 = (uint)(br_00->val_ >> ((byte)(s->br).bit_pos_ & 0x3f)) & 0x7fff;
      local_274 = 1;
      local_260 = br_00;
      goto LAB_001c454d;
    }
    bVar5 = (s->br).avail_in != 0;
    if (bVar5) {
      br_00->val_ = br_00->val_ >> 8;
      br_00->val_ = (ulong)*(s->br).next_in << 0x38 | br_00->val_;
      (s->br).bit_pos_ = (s->br).bit_pos_ - 8;
      (s->br).avail_in = (s->br).avail_in - 1;
      (s->br).next_in = (s->br).next_in + 1;
    }
    local_250 = (uint)bVar5;
    local_258 = br_00;
  } while (local_250 != 0);
  local_274 = 0;
LAB_001c454d:
  local_2a8 = br_00;
  local_280 = br_00;
  local_268 = br_00;
  local_100 = br_00;
  if (local_274 == 0) {
    local_294 = SafeDecodeSymbol(local_2a0,br_00,puStack_2b0);
  }
  else {
    local_238 = local_2b4;
    local_240 = local_2a0 + (local_2b4 & 0xff);
    if (8 < local_240->bits) {
      local_24c = local_240->bits - 8;
      local_21c = 8;
      (s->br).bit_pos_ = (s->br).bit_pos_ + 8;
      local_230 = kBitMask[local_24c];
      local_240 = local_240 + ((uint)local_240->value + (local_2b4 >> 8 & local_230));
      local_234 = local_24c;
      local_218 = br_00;
    }
    local_22c = (uint)local_240->bits;
    (s->br).bit_pos_ = local_22c + (s->br).bit_pos_;
    memento.avail_in._4_4_ = (uint32_t)local_240->value;
    local_294 = 1;
    pBStack_248 = br_00;
    local_228 = br_00;
  }
  if (local_294 == 0) {
    bVar5 = false;
    goto LAB_001c4e3e;
  }
  local_3a0 = s->block_length + 1;
  _bits = br_00;
  local_398 = s;
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    puStack_318 = &nbits_5;
    local_2ec = 0xf;
    local_2f8 = &local_31c;
    do {
      if (0xe < 0x40 - (s->br).bit_pos_) {
        local_2d8 = 0xf;
        local_2d4 = 0x7fff;
        local_31c = (uint)(br_00->val_ >> ((byte)(s->br).bit_pos_ & 0x3f)) & 0x7fff;
        local_2dc = 1;
        local_2c8 = br_00;
        goto LAB_001c48f0;
      }
      bVar5 = (s->br).avail_in != 0;
      if (bVar5) {
        br_00->val_ = br_00->val_ >> 8;
        br_00->val_ = (ulong)*(s->br).next_in << 0x38 | br_00->val_;
        (s->br).bit_pos_ = (s->br).bit_pos_ - 8;
        (s->br).avail_in = (s->br).avail_in - 1;
        (s->br).next_in = (s->br).next_in + 1;
      }
      local_2b8 = (uint)bVar5;
      local_2c0 = br_00;
    } while (local_2b8 != 0);
    local_2dc = 0;
LAB_001c48f0:
    if (local_2dc == 0) {
      local_3a8 = table;
      local_310 = br_00;
      local_308 = table;
      local_2e8 = br_00;
      local_2d0 = br_00;
      local_2fc = SafeDecodeSymbol(table,br_00,puStack_318);
    }
    else {
      local_200 = table + (local_31c & 0xff);
      if (8 < local_200->bits) {
        bVar1 = local_200->bits;
        (s->br).bit_pos_ = (s->br).bit_pos_ + 8;
        local_200 = local_200 + ((uint)local_200->value + (local_31c >> 8 & kBitMask[bVar1 - 8]));
      }
      (s->br).bit_pos_ = (uint)local_200->bits + (s->br).bit_pos_;
      nbits_5 = (uint32_t)local_200->value;
      local_2fc = 1;
    }
    if (local_2fc != 0) goto LAB_001c4aac;
    bVar5 = false;
  }
  else {
    nbits_5 = s->block_length_index;
LAB_001c4aac:
    uVar4 = (uint)kBlockLengthPrefixCode[nbits_5].nbits;
    while (0x40 - _bits->bit_pos_ < uVar4) {
      if (_bits->avail_in == 0) {
        bVar5 = false;
        goto LAB_001c4c91;
      }
      _bits->val_ = _bits->val_ >> 8;
      _bits->val_ = (ulong)*_bits->next_in << 0x38 | _bits->val_;
      _bits->bit_pos_ = _bits->bit_pos_ - 8;
      _bits->avail_in = _bits->avail_in - 1;
      _bits->next_in = _bits->next_in + 1;
    }
    local_3b8 = (uint)(_bits->val_ >> ((byte)_bits->bit_pos_ & 0x3f)) & kBitMask[uVar4];
    _bits->bit_pos_ = uVar4 + _bits->bit_pos_;
    bVar5 = true;
LAB_001c4c91:
    if (bVar5) {
      *local_3a0 = kBlockLengthPrefixCode[nbits_5].offset + local_3b8;
      local_398->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      bVar5 = true;
    }
    else {
      local_398->block_length_index = nbits_5;
      local_398->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_SUFFIX;
      bVar5 = false;
    }
  }
  if (bVar5) {
    if (memento.avail_in._4_4_ == 1) {
      memento.avail_in._4_4_ = s->block_type_rb[3] + 1;
    }
    else if (memento.avail_in._4_4_ == 0) {
      memento.avail_in._4_4_ = s->block_type_rb[2];
    }
    else {
      memento.avail_in._4_4_ = memento.avail_in._4_4_ - 2;
    }
    if (uVar2 <= memento.avail_in._4_4_) {
      memento.avail_in._4_4_ = memento.avail_in._4_4_ - uVar2;
    }
    s->block_type_rb[2] = s->block_type_rb[3];
    s->block_type_rb[3] = memento.avail_in._4_4_;
    bVar5 = true;
  }
  else {
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    br_00->val_ = local_420;
    (s->br).bit_pos_ = (uint32_t)memento.val_;
    (s->br).next_in = (uint8_t *)memento._8_8_;
    (s->br).avail_in = (size_t)memento.next_in;
    bVar5 = false;
  }
LAB_001c4e3e:
  if (bVar5) {
    s->htree_command = (s->insert_copy_hgroup).htrees[s->block_type_rb[3]];
    if ((*(ushort *)&s->field_0x338 >> 6 & 1) != 0) {
      if (s->saved_position_lengths_begin != 0) {
        (s->insert_copy_length_block_splits).positions_end
        [(s->insert_copy_length_block_splits).num_blocks] = position;
        (s->insert_copy_length_block_splits).num_blocks =
             (s->insert_copy_length_block_splits).num_blocks + 1;
      }
      (s->insert_copy_length_block_splits).positions_begin
      [(s->insert_copy_length_block_splits).num_blocks] = position;
      (s->insert_copy_length_block_splits).types[(s->insert_copy_length_block_splits).num_blocks] =
           (char)s->block_type_rb[3] +
           (char)(s->insert_copy_length_block_splits).num_types_prev_metablocks;
      uVar3 = (s->insert_copy_length_block_splits).num_types;
      local_480 = (ulong)(int)((s->insert_copy_length_block_splits).types
                               [(s->insert_copy_length_block_splits).num_blocks] + 1);
      if (local_480 < uVar3) {
        local_480 = uVar3;
      }
      (s->insert_copy_length_block_splits).num_types = local_480;
    }
    local_424 = 1;
  }
  else {
    local_424 = 0;
  }
  return local_424;
}

Assistant:

static BROTLI_BOOL BROTLI_NOINLINE SafeDecodeCommandBlockSwitch(
    BrotliDecoderState* s, int position) {
  return DecodeCommandBlockSwitchInternal(1, s, position);
}